

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

bool __thiscall
cs::domain_type::add_var_optimal(domain_type *this,var_id *id,var *val,bool override)

{
  bool bVar1;
  byte in_CL;
  any *in_RDX;
  long in_RSI;
  shared_ptr<cs::domain_ref> *in_RDI;
  var *unaff_retaddr;
  var_id *in_stack_00000008;
  undefined7 in_stack_00000010;
  shared_ptr<cs::domain_ref> *in_stack_ffffffffffffffc8;
  bool local_1;
  
  bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffc8);
  if (bVar1) {
    if (((ulong)in_RDI[5].super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi & 1) == 0) {
      if ((in_CL & 1) == 0) {
        local_1 = false;
      }
      else {
        add_var((domain_type *)CONCAT17(override,in_stack_00000010),in_stack_00000008,unaff_retaddr)
        ;
        local_1 = true;
      }
    }
    else {
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[]
                ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)(in_RDI + 4),
                 *(size_type *)(in_RSI + 8));
      cs_impl::any::operator=((any *)in_RDI,in_RDX);
      local_1 = true;
    }
  }
  else {
    add_var((domain_type *)CONCAT17(override,in_stack_00000010),in_stack_00000008,unaff_retaddr);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool add_var_optimal(const var_id &id, const var &val, bool override = false)
		{
			if (id.m_ref == m_ref) {
				if (optimize) {
					m_slot[id.m_slot_id] = val;
					return true;
				}
				else if (override) {
					add_var(id, val);
					return true;
				}
				else
					return false;
			}
			else {
				add_var(id, val);
				return true;
			}
		}